

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264_stream.cpp
# Opt level: O3

void read_hrd_parameters(h264_stream_t *h,bs_t *b)

{
  sps_t *psVar1;
  byte *pbVar2;
  byte bVar3;
  uint32_t r_1;
  uint uVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  byte *pbVar11;
  uint32_t r;
  int iVar12;
  ulong uVar13;
  uint uVar14;
  uint uVar15;
  bool bVar16;
  
  psVar1 = h->sps;
  pbVar11 = b->p;
  pbVar2 = b->end;
  uVar7 = b->bits_left;
  uVar4 = 0xffffffff;
  iVar12 = 0;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    bVar16 = true;
    if (pbVar11 < pbVar2) {
      bVar16 = (*pbVar11 >> (uVar7 & 0x1f) & 1) == 0;
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 + 1;
    iVar12 = iVar12 + -1;
  } while (((bool)(bVar16 & uVar4 < 0x20)) && (pbVar11 < pbVar2));
  uVar4 = 0;
  if (iVar12 == -1) {
    uVar8 = 0;
  }
  else {
    iVar6 = -2 - iVar12;
    iVar9 = -3 - iVar12;
    uVar8 = 0;
    do {
      uVar7 = uVar7 - 1;
      b->bits_left = uVar7;
      uVar5 = 0;
      if (pbVar11 < pbVar2) {
        uVar5 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
        uVar7 = 8;
      }
      uVar8 = uVar8 | uVar5 << ((byte)iVar6 & 0x1f);
      iVar9 = iVar9 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar9 != -2);
  }
  uVar8 = ~(-1 << (~(byte)iVar12 & 0x1f)) + uVar8;
  (psVar1->hrd).cpb_cnt_minus1 = uVar8;
  iVar12 = 3;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar5 = 0;
    if (pbVar11 < pbVar2) {
      uVar5 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    bVar3 = (byte)iVar12 & 0x1f;
    uVar4 = uVar4 | uVar5 << bVar3;
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).bit_rate_scale = uVar4;
  uVar4 = 0 << bVar3;
  iVar12 = 3;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar5 = 0;
    if (pbVar11 < pbVar2) {
      uVar5 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 | uVar5 << ((byte)iVar12 & 0x1f);
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).cpb_size_scale = uVar4;
  if (-1 < (int)uVar8) {
    uVar13 = 0;
    do {
      uVar4 = b->bits_left;
      uVar7 = 0xffffffff;
      iVar12 = -2;
      do {
        iVar6 = iVar12;
        uVar5 = uVar7;
        uVar4 = uVar4 - 1;
        b->bits_left = uVar4;
        bVar16 = true;
        if (pbVar11 < pbVar2) {
          bVar16 = (*pbVar11 >> (uVar4 & 0x1f) & 1) == 0;
        }
        if (uVar4 == 0) {
          pbVar11 = pbVar11 + 1;
          b->p = pbVar11;
          b->bits_left = 8;
          uVar4 = 8;
        }
        uVar7 = uVar5 + 1;
      } while (((bool)(bVar16 & uVar7 < 0x20)) && (iVar12 = iVar6 + 1, pbVar11 < pbVar2));
      uVar10 = 0;
      if (uVar7 != 0) {
        do {
          uVar4 = uVar4 - 1;
          b->bits_left = uVar4;
          uVar14 = 0;
          if (pbVar11 < pbVar2) {
            uVar14 = (uint)((*pbVar11 >> (uVar4 & 0x1f) & 1) != 0);
          }
          if (uVar4 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar4 = 8;
          }
          uVar10 = uVar10 | uVar14 << ((byte)uVar5 & 0x1f);
          uVar5 = uVar5 - 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != -2);
      }
      (psVar1->hrd).bit_rate_value_minus1[uVar13] = ~(-1 << ((byte)uVar7 & 0x1f)) + uVar10;
      uVar7 = b->bits_left;
      uVar4 = 0xffffffff;
      iVar12 = -2;
      do {
        iVar6 = iVar12;
        uVar5 = uVar4;
        uVar7 = uVar7 - 1;
        b->bits_left = uVar7;
        bVar16 = true;
        if (pbVar11 < pbVar2) {
          bVar16 = (*pbVar11 >> (uVar7 & 0x1f) & 1) == 0;
        }
        if (uVar7 == 0) {
          pbVar11 = pbVar11 + 1;
          b->p = pbVar11;
          b->bits_left = 8;
          uVar7 = 8;
        }
        uVar4 = uVar5 + 1;
      } while (((bool)(bVar16 & uVar4 < 0x20)) && (iVar12 = iVar6 + 1, pbVar11 < pbVar2));
      uVar10 = 0;
      uVar14 = 0;
      if (uVar4 != 0) {
        do {
          uVar7 = uVar7 - 1;
          b->bits_left = uVar7;
          uVar15 = 0;
          if (pbVar11 < pbVar2) {
            uVar15 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar11 = pbVar11 + 1;
            b->p = pbVar11;
            b->bits_left = 8;
            uVar7 = 8;
          }
          uVar14 = uVar14 | uVar15 << ((byte)uVar5 & 0x1f);
          uVar5 = uVar5 - 1;
          iVar6 = iVar6 + -1;
        } while (iVar6 != -2);
      }
      (psVar1->hrd).cpb_size_value_minus1[uVar13] = ~(-1 << ((byte)uVar4 & 0x1f)) + uVar14;
      uVar7 = b->bits_left - 1;
      b->bits_left = uVar7;
      if (pbVar11 < pbVar2) {
        uVar10 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar11 = pbVar11 + 1;
        b->p = pbVar11;
        b->bits_left = 8;
      }
      (psVar1->hrd).cbr_flag[uVar13] = uVar10;
      bVar16 = uVar13 < uVar8;
      uVar13 = uVar13 + 1;
    } while (bVar16);
    uVar7 = b->bits_left;
  }
  uVar4 = 0;
  iVar12 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar11 < pbVar2) {
      uVar8 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 | uVar8 << ((byte)iVar12 & 0x1f);
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).initial_cpb_removal_delay_length_minus1 = uVar4;
  uVar4 = 0;
  iVar12 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar11 < pbVar2) {
      uVar8 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 | uVar8 << ((byte)iVar12 & 0x1f);
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).cpb_removal_delay_length_minus1 = uVar4;
  uVar4 = 0;
  iVar12 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar11 < pbVar2) {
      uVar8 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 | uVar8 << ((byte)iVar12 & 0x1f);
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).dpb_output_delay_length_minus1 = uVar4;
  uVar4 = 0;
  iVar12 = 4;
  do {
    uVar7 = uVar7 - 1;
    b->bits_left = uVar7;
    uVar8 = 0;
    if (pbVar11 < pbVar2) {
      uVar8 = (uint)((*pbVar11 >> (uVar7 & 0x1f) & 1) != 0);
    }
    if (uVar7 == 0) {
      pbVar11 = pbVar11 + 1;
      b->p = pbVar11;
      b->bits_left = 8;
      uVar7 = 8;
    }
    uVar4 = uVar4 | uVar8 << ((byte)iVar12 & 0x1f);
    bVar16 = iVar12 != 0;
    iVar12 = iVar12 + -1;
  } while (bVar16);
  (psVar1->hrd).time_offset_length = uVar4;
  return;
}

Assistant:

void read_hrd_parameters(h264_stream_t* h, bs_t* b)
{
    sps_t* sps = h->sps;
    int SchedSelIdx;

    sps->hrd.cpb_cnt_minus1 = bs_read_ue(b);
    sps->hrd.bit_rate_scale = bs_read_u(b,4);
    sps->hrd.cpb_size_scale = bs_read_u(b,4);
    for( SchedSelIdx = 0; SchedSelIdx <= sps->hrd.cpb_cnt_minus1; SchedSelIdx++ )
    {
        sps->hrd.bit_rate_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cpb_size_value_minus1[ SchedSelIdx ] = bs_read_ue(b);
        sps->hrd.cbr_flag[ SchedSelIdx ] = bs_read_u1(b);
    }
    sps->hrd.initial_cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.cpb_removal_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.dpb_output_delay_length_minus1 = bs_read_u(b,5);
    sps->hrd.time_offset_length = bs_read_u(b,5);
}